

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall
Tokenizer::registerReplacementString(Tokenizer *this,Identifier *identifier,StringLiteral *newValue)

{
  Replacement replacement;
  Token tok;
  value_type local_100;
  string local_c8 [32];
  string local_a8;
  Token local_88;
  
  local_88.originalText._M_dataplus._M_p = (pointer)&local_88.originalText.field_2;
  local_88.value.super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
  super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_index =
       '\0';
  local_88.line = 0;
  local_88.column._0_5_ = 0;
  local_88.column._5_3_ = 0;
  local_88.checked = false;
  local_88.originalText._M_string_length = 0;
  local_88.originalText.field_2._M_local_buf[0] = '\0';
  local_88.type = String;
  std::__cxx11::string::string(local_c8,(string *)newValue);
  std::__cxx11::string::string((string *)&local_a8,(string *)newValue);
  Token::setValue<StringLiteral>(&local_88,(StringLiteral *)local_c8,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string(local_c8);
  local_100.identifier._name._M_dataplus._M_p = (pointer)&local_100.identifier._name.field_2;
  local_100.identifier._name._M_string_length = 0;
  local_100.identifier._name.field_2._M_local_buf[0] = '\0';
  local_100.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_100.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_100.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&local_100);
  std::vector<Token,_std::allocator<Token>_>::push_back(&local_100.value,&local_88);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::push_back
            (&this->replacements,&local_100);
  Replacement::~Replacement(&local_100);
  Token::~Token(&local_88);
  return;
}

Assistant:

void Tokenizer::registerReplacementString(const Identifier& identifier, const StringLiteral& newValue)
{
	Token tok;
	tok.type = TokenType::String;
	tok.setValue(newValue, newValue.string());

	Replacement replacement;
	replacement.identifier = identifier;
	replacement.value.push_back(tok);

	replacements.push_back(replacement);
}